

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleApplicationError
          (HttpServerErrorHandler *this,Exception *exception,
          Maybe<kj::HttpService::Response_&> *response)

{
  int iVar1;
  char *pcVar2;
  Disposer *pDVar3;
  AsyncOutputStream *pAVar4;
  char *in_RCX;
  undefined1 *puVar5;
  PromiseArenaMember *pPVar6;
  StringPtr value;
  String errorMessage;
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  HttpHeaders headers;
  HttpHeaderTable headerTable;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_138;
  ArrayDisposer *local_128;
  PromiseArenaMember *local_118;
  PromiseArenaMember *pPStack_110;
  String local_100;
  HttpHeaders local_e8;
  undefined1 local_88 [8];
  undefined1 *local_80;
  undefined1 local_78 [8];
  undefined1 *local_70;
  undefined1 local_68 [8];
  undefined1 *local_60;
  HttpHeaderTable local_58;
  
  if (*(int *)((long)&response[4].ptr + 4) != 2) {
    pcVar2 = (((Exception *)in_RCX)->ownFile).content.ptr;
    if (pcVar2 != (char *)0x0) {
      if (kj::_::Debug::minSeverity < 1) {
        in_RCX = "\"threw exception while serving HTTP response\", exception";
        kj::_::Debug::log<char_const(&)[44],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x206c,INFO,"\"threw exception while serving HTTP response\", exception",
                   (char (*) [44])"threw exception while serving HTTP response",
                   (Exception *)response);
      }
      HttpHeaderTable::HttpHeaderTable(&local_58);
      HttpHeaders::HttpHeaders(&local_e8,&local_58);
      value.content.size_ = 0xb;
      value.content.ptr = "text/plain";
      anon_unknown_36::requireValidHeaderValue(value);
      local_e8.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
      local_e8.indexedHeaders.ptr[0xe].content.size_ = 0xb;
      local_138.disposer = (Disposer *)0x0;
      local_138.ptr = (AsyncOutputStream *)0x0;
      local_128 = (ArrayDisposer *)0x0;
      local_118 = (PromiseArenaMember *)0x0;
      pPStack_110 = (PromiseArenaMember *)0x0;
      iVar1 = *(int *)((long)&response[4].ptr + 4);
      if (iVar1 == 3) {
        str<char_const(&)[64],kj::Exception&>
                  (&local_100,
                   (kj *)"ERROR: The server does not implement this operation. Details:\n\n",
                   (char (*) [64])response,(Exception *)in_RCX);
        pAVar4 = local_138.ptr;
        pDVar3 = local_138.disposer;
        if (local_138.disposer != (Disposer *)0x0) {
          local_138.disposer = (Disposer *)0x0;
          local_138.ptr = (AsyncOutputStream *)0x0;
          (*(code *)*local_128->_vptr_ArrayDisposer)(local_128,pDVar3,1,pAVar4,pAVar4,0);
        }
        local_138.disposer = (Disposer *)local_100.content.ptr;
        local_138.ptr = (AsyncOutputStream *)local_100.content.size_;
        local_128 = local_100.content.disposer;
        local_70 = (undefined1 *)0x0;
        if ((PromiseArenaMember *)local_100.content.size_ != (PromiseArenaMember *)0x0) {
          local_70 = (undefined1 *)
                     ((long)&((PromiseArenaMember *)(local_100.content.size_ + -0x10))->arena + 7);
        }
        local_78[0] = 1;
        (*(code *)**(undefined8 **)pcVar2)
                  (&local_100,pcVar2,0x1f5,"Not Implemented",0x10,&local_e8,local_78);
      }
      else if (iVar1 == 1) {
        str<char_const(&)[75],kj::Exception&>
                  (&local_100,
                   (kj *)
                   "ERROR: The server is temporarily unable to handle your request. Details:\n\n",
                   (char (*) [75])response,(Exception *)in_RCX);
        pAVar4 = local_138.ptr;
        pDVar3 = local_138.disposer;
        if (local_138.disposer != (Disposer *)0x0) {
          local_138.disposer = (Disposer *)0x0;
          local_138.ptr = (AsyncOutputStream *)0x0;
          (*(code *)*local_128->_vptr_ArrayDisposer)(local_128,pDVar3,1,pAVar4,pAVar4,0);
        }
        local_138.disposer = (Disposer *)local_100.content.ptr;
        local_138.ptr = (AsyncOutputStream *)local_100.content.size_;
        local_128 = local_100.content.disposer;
        local_60 = (undefined1 *)0x0;
        if ((PromiseArenaMember *)local_100.content.size_ != (PromiseArenaMember *)0x0) {
          local_60 = (undefined1 *)
                     ((long)&((PromiseArenaMember *)(local_100.content.size_ + -0x10))->arena + 7);
        }
        local_68[0] = 1;
        (*(code *)**(undefined8 **)pcVar2)
                  (&local_100,pcVar2,0x1f7,"Service Unavailable",0x14,&local_e8,local_68);
      }
      else {
        str<char_const(&)[49],kj::Exception&>
                  (&local_100,(kj *)"ERROR: The server threw an exception. Details:\n\n",
                   (char (*) [49])response,(Exception *)in_RCX);
        pAVar4 = local_138.ptr;
        pDVar3 = local_138.disposer;
        if (local_138.disposer != (Disposer *)0x0) {
          local_138.disposer = (Disposer *)0x0;
          local_138.ptr = (AsyncOutputStream *)0x0;
          (*(code *)*local_128->_vptr_ArrayDisposer)(local_128,pDVar3,1,pAVar4,pAVar4,0);
        }
        local_138.disposer = (Disposer *)local_100.content.ptr;
        local_138.ptr = (AsyncOutputStream *)local_100.content.size_;
        local_128 = local_100.content.disposer;
        local_80 = (undefined1 *)0x0;
        if ((PromiseArenaMember *)local_100.content.size_ != (PromiseArenaMember *)0x0) {
          local_80 = (undefined1 *)
                     ((long)&((PromiseArenaMember *)(local_100.content.size_ + -0x10))->arena + 7);
        }
        local_88[0] = 1;
        (*(code *)**(undefined8 **)pcVar2)
                  (&local_100,pcVar2,500,"Internal Server Error",0x16,&local_e8,local_88);
      }
      local_118 = (PromiseArenaMember *)local_100.content.ptr;
      pPStack_110 = (PromiseArenaMember *)local_100.content.size_;
      pPVar6 = (PromiseArenaMember *)local_138.ptr;
      if ((PromiseArenaMember *)local_138.ptr != (PromiseArenaMember *)0x0) {
        pPVar6 = (PromiseArenaMember *)local_138.disposer;
      }
      puVar5 = (undefined1 *)0x0;
      if ((PromiseArenaMember *)local_138.ptr != (PromiseArenaMember *)0x0) {
        puVar5 = (undefined1 *)
                 ((long)&((PromiseArenaMember *)((long)local_138.ptr + -0x10))->arena + 7);
      }
      (***(_func_int ***)local_100.content.size_)(&local_100,local_100.content.size_,pPVar6,puVar5);
      Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                ((Promise<void> *)this,&local_100,&local_138);
      pcVar2 = local_100.content.ptr;
      if ((PromiseArenaMember *)local_100.content.ptr != (PromiseArenaMember *)0x0) {
        local_100.content.ptr = (char *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar2);
      }
      pPVar6 = pPStack_110;
      if (pPStack_110 != (PromiseArenaMember *)0x0) {
        pPStack_110 = (PromiseArenaMember *)0x0;
        (**local_118->_vptr_PromiseArenaMember)
                  (local_118,
                   (_func_int *)
                   ((long)&pPVar6->_vptr_PromiseArenaMember +
                   (long)pPVar6->_vptr_PromiseArenaMember[-2]));
      }
      pAVar4 = local_138.ptr;
      pDVar3 = local_138.disposer;
      if ((PromiseArenaMember *)local_138.disposer != (PromiseArenaMember *)0x0) {
        local_138.disposer = (Disposer *)0x0;
        local_138.ptr = (AsyncOutputStream *)0x0;
        (**local_128->_vptr_ArrayDisposer)(local_128,pDVar3,1,pAVar4,pAVar4,0);
      }
      HttpHeaders::~HttpHeaders(&local_e8);
      HttpHeaderTable::~HttpHeaderTable(&local_58);
      return (PromiseBase)(PromiseBase)this;
    }
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[64],char_const(&)[35],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x2087,ERROR,
                 "\"HttpService threw exception after generating a partial response\", \"too late to report error to client\", exception"
                 ,(char (*) [64])"HttpService threw exception after generating a partial response",
                 (char (*) [35])"too late to report error to client",(Exception *)response);
    }
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleApplicationError(
    kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) {
  // Default error handler implementation.

  if (exception.getType() == kj::Exception::Type::DISCONNECTED) {
    // How do we tell an HTTP client that there was a transient network error, and it should
    // try again immediately? There's no HTTP status code for this (503 is meant for "try
    // again later, not now"). Here's an idea: Don't send any response; just close the
    // connection, so that it looks like the connection between the HTTP client and server
    // was dropped. A good client should treat this exactly the way we want.
    //
    // We also bail here to avoid logging the disconnection, which isn't very interesting.
    return kj::READY_NOW;
  }

  KJ_IF_SOME(r, response) {
    KJ_LOG(INFO, "threw exception while serving HTTP response", exception);

    HttpHeaderTable headerTable {};
    HttpHeaders headers(headerTable);
    headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    kj::String errorMessage;
    kj::Own<AsyncOutputStream> body;

    if (exception.getType() == kj::Exception::Type::OVERLOADED) {
      errorMessage = kj::str(
          "ERROR: The server is temporarily unable to handle your request. Details:\n\n", exception);
      body = r.send(503, "Service Unavailable", headers, errorMessage.size());
    } else if (exception.getType() == kj::Exception::Type::UNIMPLEMENTED) {
      errorMessage = kj::str(
          "ERROR: The server does not implement this operation. Details:\n\n", exception);
      body = r.send(501, "Not Implemented", headers, errorMessage.size());
    } else {
      errorMessage = kj::str(
          "ERROR: The server threw an exception. Details:\n\n", exception);
      body = r.send(500, "Internal Server Error", headers, errorMessage.size());
    }

    return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
  }

  KJ_LOG(ERROR, "HttpService threw exception after generating a partial response",
                "too late to report error to client", exception);
  return kj::READY_NOW;
}